

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O2

Error __thiscall asmjit::ZoneBitVector::fill(ZoneBitVector *this,size_t from,size_t to,bool value)

{
  ulong *puVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Error EVar5;
  ulong uVar6;
  sbyte sVar7;
  sbyte sVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  if (from < to) {
    if (*(ulong *)(this + 8) < from) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/zone.cpp"
                 ,0x23b,"from <= _length");
    }
    if (*(ulong *)(this + 8) < to) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/zone.cpp"
                 ,0x23c,"to <= _length");
    }
    lVar2 = *(long *)this;
    if (lVar2 == 0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/zone.cpp"
                 ,0x248,"data != nullptr");
    }
    uVar6 = from >> 6;
    uVar10 = (uint)from & 0x3f;
    uVar11 = to >> 6;
    uVar9 = (uint)to & 0x3f;
    sVar7 = (sbyte)uVar9;
    if ((from & 0x3f) != 0) {
      sVar8 = (sbyte)uVar10;
      if (uVar6 == uVar11) {
        if (uVar10 < uVar9) {
          uVar11 = ~(-1L << (sVar7 - sVar8 & 0x3fU)) << sVar8;
          if (value) {
            puVar1 = (ulong *)(lVar2 + uVar6 * 8);
            *puVar1 = *puVar1 | uVar11;
          }
          else {
            puVar1 = (ulong *)(lVar2 + uVar6 * 8);
            *puVar1 = *puVar1 & ~uVar11;
          }
          return 0;
        }
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/zone.cpp"
                   ,0x24d,"startBit < endBit");
      }
      if (value) {
        puVar1 = (ulong *)(lVar2 + uVar6 * 8);
        *puVar1 = *puVar1 | -1L << sVar8;
      }
      else {
        puVar1 = (ulong *)(lVar2 + uVar6 * 8);
        *puVar1 = *puVar1 & ~(-1L << sVar8);
      }
      uVar6 = uVar6 + 1;
    }
    auVar4 = _DAT_0012d9e0;
    auVar3 = _DAT_0012d9d0;
    lVar12 = uVar11 - uVar6;
    if (uVar6 <= uVar11 && lVar12 != 0) {
      lVar13 = lVar12 + -1;
      auVar14._8_4_ = (int)lVar13;
      auVar14._0_8_ = lVar13;
      auVar14._12_4_ = (int)((ulong)lVar13 >> 0x20);
      lVar13 = lVar2 + uVar6 * 8;
      uVar6 = 0;
      auVar14 = auVar14 ^ _DAT_0012d9e0;
      do {
        auVar15._8_4_ = (int)uVar6;
        auVar15._0_8_ = uVar6;
        auVar15._12_4_ = (int)(uVar6 >> 0x20);
        auVar15 = (auVar15 | auVar3) ^ auVar4;
        if ((bool)(~(auVar15._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar15._0_4_ ||
                    auVar14._4_4_ < auVar15._4_4_) & 1)) {
          *(ulong *)(lVar13 + uVar6 * 8) = -(ulong)value;
        }
        if ((auVar15._12_4_ != auVar14._12_4_ || auVar15._8_4_ <= auVar14._8_4_) &&
            auVar15._12_4_ <= auVar14._12_4_) {
          *(ulong *)(lVar13 + 8 + uVar6 * 8) = -(ulong)value;
        }
        uVar6 = uVar6 + 2;
      } while ((lVar12 + 1U & 0xfffffffffffffffe) != uVar6);
    }
    EVar5 = 0;
    if ((to & 0x3f) != 0) {
      uVar6 = -1L << sVar7;
      EVar5 = 0;
      if (value) {
        puVar1 = (ulong *)(lVar2 + uVar11 * 8);
        *puVar1 = *puVar1 | ~uVar6;
      }
      else {
        puVar1 = (ulong *)(lVar2 + uVar11 * 8);
        *puVar1 = *puVar1 & uVar6;
      }
    }
  }
  else {
    EVar5 = (uint)(to < from) + (uint)(to < from) * 2;
  }
  return EVar5;
}

Assistant:

Error ZoneBitVector::fill(size_t from, size_t to, bool value) noexcept {
  if (ASMJIT_UNLIKELY(from >= to)) {
    if (from > to)
      return DebugUtils::errored(kErrorInvalidArgument);
    else
      return kErrorOk;
  }

  ASMJIT_ASSERT(from <= _length);
  ASMJIT_ASSERT(to <= _length);

  // This is very similar to `ZoneBitVector::_fill()`, however, since we
  // actually set bits that are already part of the container we need to
  // special case filiing to zeros and ones.
  size_t idx = from / kBitsPerWord;
  size_t startBit = from % kBitsPerWord;

  size_t endIdx = to / kBitsPerWord;
  size_t endBit = to % kBitsPerWord;

  BitWord* data = _data;
  ASMJIT_ASSERT(data != nullptr);

  // Special case for non-zero `startBit`.
  if (startBit) {
    if (idx == endIdx) {
      ASMJIT_ASSERT(startBit < endBit);

      size_t nBits = endBit - startBit;
      BitWord mask = ((static_cast<BitWord>(1) << nBits) - 1) << startBit;

      if (value)
        data[idx] |= mask;
      else
        data[idx] &= ~mask;
      return kErrorOk;
    }
    else {
      BitWord mask = (static_cast<BitWord>(0) - 1) << startBit;

      if (value)
        data[idx++] |= mask;
      else
        data[idx++] &= ~mask;
    }
  }

  // Fill all bits in case there is a gap between the current `idx` and `endIdx`.
  if (idx < endIdx) {
    BitWord pattern = _patternFromBit(value);
    do {
      data[idx++] = pattern;
    } while (idx < endIdx);
  }

  // Special case for non-zero `endBit`.
  if (endBit) {
    BitWord mask = ((static_cast<BitWord>(1) << endBit) - 1);
    if (value)
      data[endIdx] |= mask;
    else
      data[endIdx] &= ~mask;
  }

  return kErrorOk;
}